

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_> __thiscall
MutableS2ShapeIndex::Iterator::Clone(Iterator *this)

{
  Iterator *in_RSI;
  unique_ptr<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
  local_20 [2];
  Iterator *this_local;
  
  this_local = this;
  absl::make_unique<MutableS2ShapeIndex::Iterator,MutableS2ShapeIndex::Iterator_const&>
            ((absl *)local_20,in_RSI);
  std::unique_ptr<S2ShapeIndex::IteratorBase,std::default_delete<S2ShapeIndex::IteratorBase>>::
  unique_ptr<MutableS2ShapeIndex::Iterator,std::default_delete<MutableS2ShapeIndex::Iterator>,void>
            ((unique_ptr<S2ShapeIndex::IteratorBase,std::default_delete<S2ShapeIndex::IteratorBase>>
              *)this,local_20);
  std::
  unique_ptr<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>_>::
  ~unique_ptr(local_20);
  return (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
          )(__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
            )this;
}

Assistant:

unique_ptr<MutableS2ShapeIndex::IteratorBase>
MutableS2ShapeIndex::Iterator::Clone() const {
  return absl::make_unique<Iterator>(*this);
}